

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
num_keys_in_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  *this,int left,int right)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  sbyte sVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (((-1 < left) && (left <= right)) && (right <= this->data_capacity_)) {
    puVar2 = this->bitmap_;
    uVar10 = (uint)left >> 6;
    uVar9 = (uint)right >> 6;
    uVar7 = -1L << ((ulong)(uint)left & 0x3f);
    if (uVar10 == uVar9) {
      bVar6 = (byte)right & 0x3f;
      sVar3 = (bVar6 < 0x41) * ('@' - bVar6);
      iVar4 = (int)POPCOUNT((uVar7 << sVar3) >> sVar3 & puVar2[uVar10]);
    }
    else {
      uVar8 = (ulong)(uVar10 + 1);
      lVar5 = POPCOUNT(puVar2[uVar10] & uVar7);
      iVar4 = (int)lVar5;
      if (uVar10 + 1 < uVar9) {
        do {
          puVar1 = puVar2 + uVar8;
          uVar8 = uVar8 + 1;
          lVar5 = (long)(int)lVar5 + POPCOUNT(*puVar1);
          iVar4 = (int)lVar5;
        } while (uVar9 != uVar8);
      }
      if (uVar9 != this->bitmap_size_) {
        bVar6 = (byte)right & 0x3f;
        sVar3 = (bVar6 < 0x41) * ('@' - bVar6);
        iVar4 = iVar4 + (int)POPCOUNT((puVar2[uVar9] << sVar3) >> sVar3);
      }
    }
    return iVar4;
  }
  __assert_fail("left >= 0 && left <= right && right <= data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                ,0x21c,
                "int alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::num_keys_in_range(int, int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

int num_keys_in_range(int left, int right) const {
    assert(left >= 0 && left <= right && right <= data_capacity_);
    int num_keys = 0;
    int left_bitmap_idx = left >> 6;
    int right_bitmap_idx = right >> 6;
    if (left_bitmap_idx == right_bitmap_idx) {
      uint64_t bitmap_data = bitmap_[left_bitmap_idx];
      int left_bit_pos = left - (left_bitmap_idx << 6);
      bitmap_data &= ~((1ULL << left_bit_pos) - 1);
      int right_bit_pos = right - (right_bitmap_idx << 6);
      bitmap_data &= ((1ULL << right_bit_pos) - 1);
      num_keys += _mm_popcnt_u64(bitmap_data);
    } else {
      uint64_t left_bitmap_data = bitmap_[left_bitmap_idx];
      int bit_pos = left - (left_bitmap_idx << 6);
      left_bitmap_data &= ~((1ULL << bit_pos) - 1);
      num_keys += _mm_popcnt_u64(left_bitmap_data);
      for (int i = left_bitmap_idx + 1; i < right_bitmap_idx; i++) {
        num_keys += _mm_popcnt_u64(bitmap_[i]);
      }
      if (right_bitmap_idx != bitmap_size_) {
        uint64_t right_bitmap_data = bitmap_[right_bitmap_idx];
        bit_pos = right - (right_bitmap_idx << 6);
        right_bitmap_data &= ((1ULL << bit_pos) - 1);
        num_keys += _mm_popcnt_u64(right_bitmap_data);
      }
    }
    return num_keys;
  }